

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QLayoutItem * __thiscall QDockAreaLayout::unplug(QDockAreaLayout *this,QList<int> *path)

{
  long lVar1;
  QLayoutItem *pQVar2;
  qsizetype in_RSI;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  int index;
  QList<int> *in_stack_ffffffffffffffb0;
  QList<int> *in_stack_ffffffffffffffe0;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QList<int>::first(in_stack_ffffffffffffffb0);
  QList<int>::mid(in_stack_ffffffffffffffe0,in_RDI,in_RSI);
  pQVar2 = QDockAreaLayoutInfo::unplug(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  QList<int>::~QList((QList<int> *)0x578801);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QDockAreaLayout::unplug(const QList<int> &path)
{
    Q_ASSERT(!path.isEmpty());
    const int index = path.first();
    Q_ASSERT(index >= 0 && index < QInternal::DockCount);
    return docks[index].unplug(path.mid(1));
}